

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O1

void envy_bios_print_bit_M(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_mem *mem;
  ushort uVar1;
  envy_bios_bit_entry *peVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  char *name;
  char *local_38;
  
  peVar2 = (bios->mem).bit;
  if ((mask >> 0xc & 1) != 0 && peVar2 != (envy_bios_bit_entry *)0x0) {
    mem = &bios->mem;
    fprintf((FILE *)out,"BIT table \'M\' at 0x%x, version %i\n",(ulong)peVar2->offset,
            (ulong)peVar2->version);
    peVar2 = mem->bit;
    if (1 < peVar2->t_len) {
      uVar4 = 1;
      lVar5 = 2;
      do {
        uVar3 = (ulong)peVar2->t_offset;
        if ((uint)(uVar3 + lVar5) < bios->length) {
          uVar1 = CONCAT11(bios->data[uVar3 + lVar5 & 0xffffffff],bios->data[uVar4 + uVar3]);
          if (uVar1 != 0) {
            local_38 = "UNKNOWN";
            parse_at(bios,mem,-1,(int)uVar4,&local_38);
            fprintf((FILE *)out,"0x%02x: 0x%x => %s TABLE\n",uVar4 & 0xffffffff,(ulong)uVar1,
                    local_38);
          }
        }
        else {
          fprintf(_stderr,"requested OOB u16 at 0x%04x\n",uVar3 + uVar4);
        }
        peVar2 = mem->bit;
        uVar4 = uVar4 + 2;
        lVar5 = lVar5 + 2;
      } while ((uint)uVar4 < (uint)peVar2->t_len);
    }
    fputc(10,(FILE *)out);
  }
  return;
}

Assistant:

void
envy_bios_print_bit_M (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_mem *mem = &bios->mem;
	const char *name;
	uint16_t addr;
	int ret = 0, i = 0;

	if (!mem->bit || !(mask & ENVY_BIOS_PRINT_MEM))
		return;

	fprintf(out, "BIT table 'M' at 0x%x, version %i\n",
			mem->bit->offset, mem->bit->version);

	for (i = 1; i < mem->bit->t_len; i+=2) {
		ret = bios_u16(bios, mem->bit->t_offset + i, &addr);
		if (!ret && addr) {
			name = "UNKNOWN";
			ret = parse_at(bios, mem, -1, i, &name);
			fprintf(out, "0x%02x: 0x%x => %s TABLE\n", i, addr, name);
		}
	}

	fprintf(out, "\n");
}